

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O3

void * operator_new__(size_t sz,nothrow_t *param_2)

{
  size_t *psVar1;
  Entry *pEVar2;
  ulong uVar3;
  bool bVar4;
  TheCustomHeapType *pTVar5;
  pthread_t pVar6;
  void *ptr;
  char *pcVar7;
  undefined8 extraout_RAX;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  *this;
  
  bVar4 = isCustomHeapInitialized();
  if (!bVar4) {
    pcVar10 = initBufferPtr + sz;
    if (&xxmalloc::initialized < pcVar10) {
      initBufferPtr = pcVar10;
      abort();
    }
    if (xxmalloc::initialized != '\0') {
      pcVar7 = initBufferPtr;
      initBufferPtr = pcVar10;
      return pcVar7;
    }
    pcVar7 = initBufferPtr;
    initBufferPtr = pcVar10;
    xxmalloc::initialized = 1;
    return pcVar7;
  }
  pTVar5 = getCustomHeap();
  if (sz < 0x401) {
    sVar8 = 0x10;
    if (0x10 < sz) {
      sVar8 = sz;
    }
    uVar9 = sVar8 * 2 - 1;
    uVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar9 = (uVar3 ^ 0xffffffffffffffc0) + 0x3c;
    pEVar2 = (pTVar5->
             super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
             )._localHeap._item[uVar9 & 0xffffffff].head.next;
    if (pEVar2 != (Entry *)0x0) {
      pTVar5[2].
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      ._pad[(uVar3 ^ 0xffffffffffffffc0) + 0xc] = (double)pEVar2->next;
      psVar1 = &(pTVar5->
                super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                )._localHeapBytes;
      *psVar1 = *psVar1 + (-0x10L << ((byte)uVar9 & 0x3f));
      return pEVar2;
    }
    this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
            *)(pTVar5->
              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
              )._parentHeap;
  }
  else {
    this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
            *)(pTVar5->
              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
              )._parentHeap;
    if (0x8000 < sz) {
      ptr = HL::
            HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
            ::slowPath(this,sz);
      goto LAB_0010a644;
    }
  }
  pVar6 = pthread_self();
  ptr = Hoard::LockMallocHeap<Hoard::SmallHeap>::malloc
                  ((LockMallocHeap<Hoard::SmallHeap> *)
                   ((this->super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>)._heap._item +
                   *(int *)((long)(this->super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>)
                                  ._tidMap._item + (ulong)((uint)(pVar6 >> 10) & 0x1ffc))),sz);
LAB_0010a644:
  Hoard::
  RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  ::getSize((RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
             *)this,ptr);
  if (ptr != (void *)0x0) {
    return ptr;
  }
  operator_new__();
  __cxa_call_unexpected(extraout_RAX);
}

Assistant:

void * FLATTEN operator new[] (size_t sz, const std::nothrow_t&)
  throw()
 {
  return xxmalloc(sz);
}